

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_encodedframe_overshoot_cbr(AV1_COMP *cpi,int *q)

{
  aom_tune_content aVar1;
  AV1_PRIMARY *pAVar2;
  ulong uVar3;
  int64_t iVar4;
  LAYER_CONTEXT *pLVar5;
  _Bool _Var6;
  _Bool _Var7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  
  pAVar2 = cpi->ppi;
  dVar15 = (pAVar2->p_rc).rate_correction_factors[0];
  iVar11 = (cpi->rc).avg_frame_bandwidth;
  aVar1 = (cpi->oxcf).tune_cfg.content;
  cpi->cyclic_refresh->counter_encode_maxq_scene_change = 0;
  _Var7 = false;
  if ((cpi->svc).spatial_layer_id < 1) {
LAB_00332763:
    if ((cpi->sf).rt_sf.rc_compute_spatial_var_sc == 0) {
      if ((((cpi->common).height * (cpi->common).width < 0xe1000) ||
          ((pAVar2->p_rc).buffer_level <= (pAVar2->p_rc).optimal_buffer_level >> 1)) ||
         (0x1ffff < (cpi->rc).avg_source_sad)) {
        iVar9 = (cpi->rc).worst_quality * 3 + *q >> 2;
      }
      else {
        iVar9 = (cpi->rc).worst_quality + *q >> 1;
      }
      *q = iVar9;
      if (aVar1 != AOM_CONTENT_SCREEN) goto LAB_0033281b;
LAB_003327e4:
      iVar9 = (cpi->rc).worst_quality;
    }
    else {
      uVar3 = (cpi->rc).frame_spatial_variance;
      if (uVar3 < 100) {
        iVar9 = *q + (cpi->rc).worst_quality >> 1;
      }
      else {
        if ((399 < uVar3) && ((999 < uVar3 || (79999 < (cpi->rc).frame_source_sad))))
        goto LAB_003327e4;
        iVar9 = (cpi->rc).worst_quality * 3 + *q >> 2;
      }
    }
  }
  else {
    uVar8 = cpi->ref_frame_flags;
    if ((uVar8 & 1) == 0) {
LAB_00332700:
      if ((uVar8 & 8) != 0) {
        _Var6 = av1_check_ref_is_low_spatial_res_super_frame(cpi,4);
        _Var7 = true;
        if (_Var6) goto LAB_00332737;
        uVar8 = cpi->ref_frame_flags;
      }
      _Var7 = false;
      if ((uVar8 & 0x40) == 0) goto LAB_00332763;
      _Var7 = av1_check_ref_is_low_spatial_res_super_frame(cpi,7);
    }
    else {
      _Var7 = true;
      _Var6 = av1_check_ref_is_low_spatial_res_super_frame(cpi,1);
      if (!_Var6) {
        uVar8 = cpi->ref_frame_flags;
        goto LAB_00332700;
      }
    }
LAB_00332737:
    if (_Var7 == false || (cpi->svc).spatial_layer_id < 1) goto LAB_00332763;
    iVar9 = *q + (cpi->rc).worst_quality >> 1;
    _Var7 = true;
  }
  *q = iVar9;
LAB_0033281b:
  (pAVar2->p_rc).avg_frame_qindex[1] = iVar9;
  iVar4 = (pAVar2->p_rc).optimal_buffer_level;
  (pAVar2->p_rc).buffer_level = iVar4;
  (pAVar2->p_rc).bits_off_target = iVar4;
  (cpi->rc).rc_1_frame = 0;
  (cpi->rc).rc_2_frame = 0;
  iVar9 = (cpi->common).mi_params.MBs;
  dVar14 = av1_convert_qindex_to_q(*q,((cpi->common).seq_params)->bit_depth);
  iVar10 = 2000000;
  if (aVar1 == AOM_CONTENT_SCREEN) {
    iVar10 = 1000000;
  }
  dVar14 = ((double)(int)((ulong)((long)iVar11 << 9) / (ulong)(long)iVar9) * dVar14) /
           (double)iVar10;
  if (dVar15 < dVar14) {
    dVar14 = (dVar15 + dVar14) * 0.5;
    dVar15 = 50.0;
    if (dVar14 <= 50.0) {
      dVar15 = dVar14;
    }
    (cpi->ppi->p_rc).rate_correction_factors[0] = dVar15;
  }
  iVar11 = (cpi->svc).number_temporal_layers;
  if ((1 < iVar11) && (((cpi->svc).spatial_layer_id == 0 || (_Var7 == false)))) {
    pLVar5 = (cpi->svc).layer_context;
    lVar13 = 0;
    do {
      lVar12 = (long)iVar11 * (long)(cpi->svc).spatial_layer_id + lVar13;
      pLVar5[lVar12].p_rc.avg_frame_qindex[1] = *q;
      iVar4 = pLVar5[lVar12].p_rc.optimal_buffer_level;
      pLVar5[lVar12].p_rc.buffer_level = iVar4;
      pLVar5[lVar12].p_rc.bits_off_target = iVar4;
      pLVar5[lVar12].rc.rc_1_frame = 0;
      pLVar5[lVar12].rc.rc_2_frame = 0;
      pLVar5[lVar12].p_rc.rate_correction_factors[0] = dVar15;
      iVar11 = (cpi->svc).number_temporal_layers;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 < iVar11);
  }
  return 1;
}

Assistant:

int av1_encodedframe_overshoot_cbr(AV1_COMP *cpi, int *q) {
  AV1_COMMON *const cm = &cpi->common;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  double rate_correction_factor =
      cpi->ppi->p_rc.rate_correction_factors[INTER_NORMAL];
  const int target_size = cpi->rc.avg_frame_bandwidth;
  double new_correction_factor;
  int target_bits_per_mb;
  double q2;
  int enumerator;
  int inter_layer_pred_on = 0;
  int is_screen_content = (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN);
  cpi->cyclic_refresh->counter_encode_maxq_scene_change = 0;
  if (cpi->svc.spatial_layer_id > 0) {
    // For spatial layers: check if inter-layer (spatial) prediction is used
    // (check if any reference is being used that is the lower spatial layer),
    inter_layer_pred_on = CHECK_INTER_LAYER_PRED(LAST_FRAME) ||
                          CHECK_INTER_LAYER_PRED(GOLDEN_FRAME) ||
                          CHECK_INTER_LAYER_PRED(ALTREF_FRAME);
  }
  // If inter-layer prediction is on: we expect to pull up the quality from
  // the lower spatial layer, so we can use a lower q.
  if (cpi->svc.spatial_layer_id > 0 && inter_layer_pred_on) {
    *q = (cpi->rc.worst_quality + *q) >> 1;
  } else {
    // For easy scene changes used lower QP, otherwise set max-q.
    // If rt_sf->compute_spatial_var_sc is enabled relax the max-q
    // condition based on frame spatial variance.
    if (cpi->sf.rt_sf.rc_compute_spatial_var_sc) {
      if (cpi->rc.frame_spatial_variance < 100) {
        *q = (cpi->rc.worst_quality + *q) >> 1;
      } else if (cpi->rc.frame_spatial_variance < 400 ||
                 (cpi->rc.frame_source_sad < 80000 &&
                  cpi->rc.frame_spatial_variance < 1000)) {
        *q = (3 * cpi->rc.worst_quality + *q) >> 2;
      } else {
        *q = cpi->rc.worst_quality;
      }
    } else {
      // Set a larger QP.
      const uint64_t sad_thr = 64 * 64 * 32;
      if (cm->width * cm->height >= 1280 * 720 &&
          (p_rc->buffer_level > (p_rc->optimal_buffer_level) >> 1) &&
          cpi->rc.avg_source_sad < sad_thr) {
        *q = (*q + cpi->rc.worst_quality) >> 1;
      } else {
        *q = (3 * cpi->rc.worst_quality + *q) >> 2;
      }
      // If we arrive here for screen content: use the max-q set by the user.
      if (is_screen_content) *q = cpi->rc.worst_quality;
    }
  }
  // Adjust avg_frame_qindex, buffer_level, and rate correction factors, as
  // these parameters will affect QP selection for subsequent frames. If they
  // have settled down to a very different (low QP) state, then not adjusting
  // them may cause next frame to select low QP and overshoot again.
  p_rc->avg_frame_qindex[INTER_FRAME] = *q;
  p_rc->buffer_level = p_rc->optimal_buffer_level;
  p_rc->bits_off_target = p_rc->optimal_buffer_level;
  // Reset rate under/over-shoot flags.
  cpi->rc.rc_1_frame = 0;
  cpi->rc.rc_2_frame = 0;
  // Adjust rate correction factor.
  target_bits_per_mb =
      (int)(((uint64_t)target_size << BPER_MB_NORMBITS) / cm->mi_params.MBs);
  // Reset rate correction factor: for now base it on target_bits_per_mb
  // and qp (==max_QP). This comes from the inverse computation of
  // av1_rc_bits_per_mb().
  q2 = av1_convert_qindex_to_q(*q, cm->seq_params->bit_depth);
  enumerator = get_bpmb_enumerator(INTER_NORMAL, is_screen_content);
  new_correction_factor = (double)target_bits_per_mb * q2 / enumerator;
  if (new_correction_factor > rate_correction_factor) {
    rate_correction_factor =
        (new_correction_factor + rate_correction_factor) / 2.0;
    if (rate_correction_factor > MAX_BPB_FACTOR)
      rate_correction_factor = MAX_BPB_FACTOR;
    cpi->ppi->p_rc.rate_correction_factors[INTER_NORMAL] =
        rate_correction_factor;
  }
  // For temporal layers: reset the rate control parameters across all
  // temporal layers. Only do it for spatial enhancement layers when
  // inter_layer_pred_on is not set (off).
  if (cpi->svc.number_temporal_layers > 1 &&
      (cpi->svc.spatial_layer_id == 0 || inter_layer_pred_on == 0)) {
    SVC *svc = &cpi->svc;
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int sl = svc->spatial_layer_id;
      const int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      RATE_CONTROL *lrc = &lc->rc;
      PRIMARY_RATE_CONTROL *lp_rc = &lc->p_rc;
      lp_rc->avg_frame_qindex[INTER_FRAME] = *q;
      lp_rc->buffer_level = lp_rc->optimal_buffer_level;
      lp_rc->bits_off_target = lp_rc->optimal_buffer_level;
      lrc->rc_1_frame = 0;
      lrc->rc_2_frame = 0;
      lp_rc->rate_correction_factors[INTER_NORMAL] = rate_correction_factor;
    }
  }
  return 1;
}